

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O0

int it_riff_am_process_pattern(IT_PATTERN *pattern,DUMBFILE *f,int len,int ver)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  int in_ECX;
  int in_EDX;
  DUMBFILE *in_RSI;
  int *in_RDI;
  IT_ENTRY *entry;
  int r;
  int q;
  int p;
  uint flags;
  long end;
  long start;
  int row;
  int nrows;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar9;
  long in_stack_ffffffffffffffb0;
  DUMBFILE *f_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_28;
  int local_4;
  
  iVar1 = dumbfile_getc((DUMBFILE *)
                        CONCAT17(in_stack_ffffffffffffffaf,
                                 CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  iVar1 = iVar1 + 1;
  *in_RDI = iVar1;
  in_RDI[1] = 0;
  local_28 = 0;
  iVar2 = dumbfile_pos(in_RSI);
  lVar6 = (long)iVar2 + (long)(in_EDX + -1);
  while( true ) {
    uVar9 = false;
    if (local_28 < iVar1) {
      iVar3 = dumbfile_error(in_RSI);
      uVar9 = false;
      if (iVar3 == 0) {
        iVar2 = dumbfile_pos(in_RSI);
        uVar9 = iVar2 < lVar6;
      }
    }
    if ((bool)uVar9 == false) break;
    uVar4 = dumbfile_getc((DUMBFILE *)
                          CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)));
    if (uVar4 == 0) {
      local_28 = local_28 + 1;
    }
    else if ((uVar4 & 0xe0) != 0) {
      in_RDI[1] = in_RDI[1] + 1;
      if ((uVar4 & 0x80) != 0) {
        dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0);
      }
      if ((uVar4 & 0x40) != 0) {
        dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0);
      }
      if ((uVar4 & 0x20) != 0) {
        dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0);
      }
    }
  }
  if (in_RDI[1] == 0) {
    local_4 = 0;
  }
  else {
    in_RDI[1] = iVar1 + in_RDI[1];
    pvVar7 = malloc((long)in_RDI[1] * 7);
    *(void **)(in_RDI + 2) = pvVar7;
    if (*(long *)(in_RDI + 2) == 0) {
      local_4 = -1;
    }
    else {
      f_00 = *(DUMBFILE **)(in_RDI + 2);
      local_28 = 0;
      dumbfile_seek(f_00,CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )),0);
      while( true ) {
        uVar8 = false;
        if (local_28 < iVar1) {
          iVar3 = dumbfile_error(in_RSI);
          uVar8 = false;
          if (iVar3 == 0) {
            iVar2 = dumbfile_pos(in_RSI);
            uVar8 = iVar2 < lVar6;
          }
        }
        if ((bool)uVar8 == false) break;
        uVar4 = dumbfile_getc((DUMBFILE *)CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffa8)))
        ;
        if (uVar4 == 0) {
          *(undefined1 *)&f_00->dfs = 0xff;
          f_00 = (DUMBFILE *)((long)&f_00->dfs + 7);
          local_28 = local_28 + 1;
        }
        else {
          *(byte *)&f_00->dfs = (byte)uVar4 & 0x1f;
          *(undefined1 *)((long)&f_00->dfs + 1) = 0;
          if ((uVar4 & 0xe0) != 0) {
            if ((uVar4 & 0x80) != 0) {
              iVar3 = dumbfile_getc((DUMBFILE *)
                                    CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffa8)));
              iVar5 = dumbfile_getc((DUMBFILE *)
                                    CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffa8)));
              _dumb_it_xm_convert_effect(iVar5,iVar3,(IT_ENTRY *)f_00,0);
            }
            if ((uVar4 & 0x40) != 0) {
              iVar3 = dumbfile_getc((DUMBFILE *)
                                    CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffa8)));
              iVar5 = dumbfile_getc((DUMBFILE *)
                                    CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffa8)));
              if (iVar3 != 0) {
                *(byte *)((long)&f_00->dfs + 1) = *(byte *)((long)&f_00->dfs + 1) | 2;
                *(char *)((long)&f_00->dfs + 3) = (char)iVar3;
              }
              if (iVar5 != 0) {
                *(byte *)((long)&f_00->dfs + 1) = *(byte *)((long)&f_00->dfs + 1) | 1;
                *(char *)((long)&f_00->dfs + 2) = (char)iVar5 + -1;
              }
            }
            if ((uVar4 & 0x20) != 0) {
              iVar3 = dumbfile_getc((DUMBFILE *)
                                    CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffa8)));
              *(byte *)((long)&f_00->dfs + 1) = *(byte *)((long)&f_00->dfs + 1) | 4;
              if (in_ECX == 0) {
                *(char *)((long)&f_00->dfs + 4) = (char)iVar3;
              }
              else {
                *(char *)((long)&f_00->dfs + 4) = (char)((long)(iVar3 << 6) / 0x7f);
              }
            }
            if (*(char *)((long)&f_00->dfs + 1) != '\0') {
              f_00 = (DUMBFILE *)((long)&f_00->dfs + 7);
            }
          }
        }
      }
      for (; local_28 < iVar1; local_28 = local_28 + 1) {
        *(undefined1 *)&f_00->dfs = 0xff;
        f_00 = (DUMBFILE *)((long)&f_00->dfs + 7);
      }
      in_RDI[1] = (int)(((long)f_00 - *(long *)(in_RDI + 2)) / 7);
      if (in_RDI[1] == 0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int it_riff_am_process_pattern( IT_PATTERN * pattern, DUMBFILE * f, int len, int ver )
{
    int nrows, row;
    long start, end;
	unsigned flags;
    int p, q, r;
	IT_ENTRY * entry;

    nrows = dumbfile_getc( f ) + 1;

	pattern->n_rows = nrows;

	len -= 1;

	pattern->n_entries = 0;

	row = 0;

    start = dumbfile_pos( f );
    end = start + len;

    while ( (row < nrows) && !dumbfile_error( f ) && (dumbfile_pos( f ) < end) ) {
        p = dumbfile_getc( f );
        if ( ! p ) {
			++ row;
			continue;
		}

        flags = p & 0xE0;

        if (flags) {
			++ pattern->n_entries;
            if (flags & 0x80) dumbfile_skip( f, 2 );
            if (flags & 0x40) dumbfile_skip( f, 2 );
            if (flags & 0x20) dumbfile_skip( f, 1 );
		}
	}

	if ( ! pattern->n_entries ) return 0;

	pattern->n_entries += nrows;

	pattern->entry = malloc( pattern->n_entries * sizeof( * pattern->entry ) );
	if ( ! pattern->entry ) return -1;

	entry = pattern->entry;

	row = 0;

    dumbfile_seek( f, start, DFS_SEEK_SET );

    while ( ( row < nrows ) && !dumbfile_error( f ) && ( dumbfile_pos( f ) < end ) )
	{
        p = dumbfile_getc( f );

        if ( ! p )
		{
			IT_SET_END_ROW( entry );
			++ entry;
			++ row;
			continue;
		}

        flags = p;
		entry->channel = flags & 0x1F;
		entry->mask = 0;

		if (flags & 0xE0)
		{
			if ( flags & 0x80 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                _dumb_it_xm_convert_effect( r, q, entry, 0 );
			}

			if ( flags & 0x40 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_INSTRUMENT;
                    entry->instrument = q;
				}
                if ( r )
				{
					entry->mask |= IT_ENTRY_NOTE;
                    entry->note = r - 1;
				}
			}

			if ( flags & 0x20 )
			{
                q = dumbfile_getc( f );
				entry->mask |= IT_ENTRY_VOLPAN;
                if ( ver == 0 ) entry->volpan = q;
                else entry->volpan = q * 64 / 127;
			}

			if (entry->mask) entry++;
		}
	}

	while ( row < nrows )
	{
		IT_SET_END_ROW( entry );
		++ entry;
		++ row;
	}

	pattern->n_entries = (int)(entry - pattern->entry);
	if ( ! pattern->n_entries ) return -1;

	return 0;
}